

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilksort-seq.c
# Opt level: O3

void scramble_array(ELM *arr,unsigned_long size)

{
  ELM EVar1;
  unsigned_long uVar2;
  
  if (size != 0) {
    uVar2 = 0;
    do {
      rand_nxt = rand_nxt * 0x41c64e6d + 0x3039;
      EVar1 = arr[uVar2];
      arr[uVar2] = arr[rand_nxt % size];
      arr[rand_nxt % size] = EVar1;
      uVar2 = uVar2 + 1;
    } while (size != uVar2);
  }
  return;
}

Assistant:

void scramble_array(ELM *arr, unsigned long size)
{
    unsigned long i;
    unsigned long j;

    for (i = 0; i < size; ++i) {
        j = my_rand();
        j = j % size;
        swap(arr[i], arr[j]);
    }
}